

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

void __thiscall f8n::runtime::MessageQueue::Dispatch(MessageQueue *this,IMessagePtr *message)

{
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
  *this_00;
  _Base_ptr p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var4;
  const_iterator __position;
  _Iter in_R8;
  insert_iterator<std::set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>_>
  __result;
  LockT lock;
  shared_ptr<f8n::runtime::IMessageTarget> shared;
  set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  copy;
  undefined1 local_a0 [16];
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
  *local_90;
  MessageQueue *local_88;
  _Base_ptr local_80;
  mutex *local_78;
  __shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2> local_70;
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  local_60;
  
  iVar3 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_IMessage[2])();
  if (CONCAT44(extraout_var,iVar3) != 0) {
    iVar3 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_IMessage[2])();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x10))
              ((long *)CONCAT44(extraout_var_00,iVar3),
               (message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    return;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_a0,&this->queueMutex);
  local_80 = &(this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header;
  __result.iter._M_node = in_R8._M_node;
  __result.container =
       (set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
        *)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = &this->queueMutex;
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>>,std::insert_iterator<std::set<std::weak_ptr<f8n::runtime::IMessageTarget>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>>>
            ((__copy_move<false,false,std::bidirectional_iterator_tag> *)
             (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>)local_80,
             (_Base_ptr)&local_60,__result);
  local_90 = (_Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
              *)&this->receivers;
  local_88 = this;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_a0);
  bVar2 = false;
  for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::__weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2> *)local_a0,
               (__weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 1))
    ;
    std::__shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,(unique_lock<std::mutex> *)local_a0);
    if (local_70._M_ptr == (element_type *)0x0) {
      bVar2 = true;
    }
    else {
      (**(code **)(*(long *)local_70._M_ptr + 0x10))
                (local_70._M_ptr,
                 (message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  }
  if (bVar2) {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_a0,local_78);
    p_Var1 = local_80;
    this_00 = local_90;
    __position._M_node = (local_88->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (__position._M_node != p_Var1) {
      if ((__position._M_node[1]._M_parent == (_Base_ptr)0x0) ||
         (*(int *)&(__position._M_node[1]._M_parent)->_M_parent == 0)) {
        __position._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
             ::erase_abi_cxx11_(this_00,__position);
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_a0);
  }
  std::
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MessageQueue::Dispatch(IMessagePtr message) {
    if (message->Target()) {
        message->Target()->ProcessMessage(*message);
    }
    else {
        std::set<IWeakMessageTarget, WeakPtrLess> copy;

        /* copy to dispatch outside of a lock */
        {
            LockT lock(this->queueMutex);
            std::copy(
                receivers.begin(),
                receivers.end(),
                std::inserter(copy, copy.begin()));
        }

        /* dispatch */
        bool prune = false;
        for (auto receiver : copy) {
            auto shared = receiver.lock();
            if (shared) {
                shared->ProcessMessage(*message);
            }
            else {
                prune = true;
            }
        }

        if (prune) { /* at least one of our weak_ptrs is dead. */
            LockT lock(this->queueMutex);
            auto it = this->receivers.begin();
            while (it != this->receivers.end()) {
                if (it->expired()) {
                    it = this->receivers.erase(it);
                }
                else {
                    ++it;
                }
            }
        }
    }
}